

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fovYRadians,float aspect,float zNear,float zFar,
          bool directX)

{
  undefined3 in_register_00000031;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  
  *(undefined1 (*) [32])(__return_storage_ptr__->m_elements + 8) = ZEXT1232(ZEXT812(0));
  *(undefined1 (*) [32])(__return_storage_ptr__->m_elements + 1) = ZEXT1232(ZEXT812(0));
  fVar1 = tanf(fovYRadians * 0.5);
  __return_storage_ptr__->m_elements[0] = (1.0 / fVar1) / aspect;
  __return_storage_ptr__->m_elements[5] = 1.0 / fVar1;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    fVar1 = zNear - zFar;
    auVar4._4_4_ = fVar1;
    auVar4._0_4_ = fVar1;
    auVar4._8_4_ = fVar1;
    auVar4._12_4_ = fVar1;
    auVar3 = vinsertps_avx(ZEXT416((uint)(zNear + zFar)),ZEXT416((uint)((zFar + zFar) * zNear)),0x10
                          );
    auVar3 = vdivps_avx(auVar3,auVar4);
  }
  else {
    auVar3._4_4_ = in_XMM3_Db;
    auVar3._0_4_ = zFar;
    auVar3._8_4_ = in_XMM3_Dc;
    auVar3._12_4_ = in_XMM3_Dd;
    fVar1 = zNear - zFar;
    auVar2._4_4_ = fVar1;
    auVar2._0_4_ = fVar1;
    auVar2._8_4_ = fVar1;
    auVar2._12_4_ = fVar1;
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(zNear * zFar)),0x10);
    auVar3 = vdivps_avx(auVar3,auVar2);
  }
  __return_storage_ptr__->m_elements[10] = auVar3._0_4_;
  fVar1 = (float)vextractps_avx(auVar3,1);
  __return_storage_ptr__->m_elements[0xe] = fVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}